

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O3

void deqp::gles3::Functional::eval_rightShiftVecScalar_ivec4(ShaderEvalContext *c)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  
  iVar2 = (int)c->in[0].m_data[0];
  iVar3 = (int)c->in[0].m_data[1];
  iVar4 = (int)c->in[0].m_data[2];
  iVar5 = (int)c->in[0].m_data[3];
  uVar1 = (uint)c->in[1].m_data[0];
  auVar7 = ZEXT416(uVar1);
  uVar6 = (ulong)uVar1;
  (c->color).m_data[0] = (float)(int)(~(0xffffffffU >> uVar6) & iVar3 >> 0x1f | iVar3 >> auVar7);
  (c->color).m_data[1] = (float)(int)(~(0xffffffffU >> uVar6) & iVar4 >> 0x1f | iVar4 >> auVar7);
  (c->color).m_data[2] = (float)(int)(~(0xffffffffU >> uVar6) & iVar5 >> 0x1f | iVar5 >> auVar7);
  (c->color).m_data[3] = (float)(int)(~(0xffffffffU >> uVar6) & iVar2 >> 0x1f | iVar2 >> auVar7);
  return;
}

Assistant:

Vector<T, 4>			swizzle		(int a, int b, int c, int d) const { DE_ASSERT(a >= 0 && a < Size); DE_ASSERT(b >= 0 && b < Size); DE_ASSERT(c >= 0 && c < Size); DE_ASSERT(d >= 0 && d < Size); return Vector<T, 4>(m_data[a], m_data[b], m_data[c], m_data[d]); }